

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001b0f60 = 0x2d2d2d2d2d2d2d;
    uRam00000000001b0f67._0_1_ = '-';
    uRam00000000001b0f67._1_1_ = '-';
    uRam00000000001b0f67._2_1_ = '-';
    uRam00000000001b0f67._3_1_ = '-';
    uRam00000000001b0f67._4_1_ = '-';
    uRam00000000001b0f67._5_1_ = '-';
    uRam00000000001b0f67._6_1_ = '-';
    uRam00000000001b0f67._7_1_ = '-';
    DAT_001b0f50 = '-';
    DAT_001b0f50_1._0_1_ = '-';
    DAT_001b0f50_1._1_1_ = '-';
    DAT_001b0f50_1._2_1_ = '-';
    DAT_001b0f50_1._3_1_ = '-';
    DAT_001b0f50_1._4_1_ = '-';
    DAT_001b0f50_1._5_1_ = '-';
    DAT_001b0f50_1._6_1_ = '-';
    uRam00000000001b0f58 = 0x2d2d2d2d2d2d2d;
    DAT_001b0f5f = 0x2d;
    DAT_001b0f40 = '-';
    DAT_001b0f40_1._0_1_ = '-';
    DAT_001b0f40_1._1_1_ = '-';
    DAT_001b0f40_1._2_1_ = '-';
    DAT_001b0f40_1._3_1_ = '-';
    DAT_001b0f40_1._4_1_ = '-';
    DAT_001b0f40_1._5_1_ = '-';
    DAT_001b0f40_1._6_1_ = '-';
    uRam00000000001b0f48._0_1_ = '-';
    uRam00000000001b0f48._1_1_ = '-';
    uRam00000000001b0f48._2_1_ = '-';
    uRam00000000001b0f48._3_1_ = '-';
    uRam00000000001b0f48._4_1_ = '-';
    uRam00000000001b0f48._5_1_ = '-';
    uRam00000000001b0f48._6_1_ = '-';
    uRam00000000001b0f48._7_1_ = '-';
    DAT_001b0f30 = '-';
    DAT_001b0f30_1._0_1_ = '-';
    DAT_001b0f30_1._1_1_ = '-';
    DAT_001b0f30_1._2_1_ = '-';
    DAT_001b0f30_1._3_1_ = '-';
    DAT_001b0f30_1._4_1_ = '-';
    DAT_001b0f30_1._5_1_ = '-';
    DAT_001b0f30_1._6_1_ = '-';
    uRam00000000001b0f38._0_1_ = '-';
    uRam00000000001b0f38._1_1_ = '-';
    uRam00000000001b0f38._2_1_ = '-';
    uRam00000000001b0f38._3_1_ = '-';
    uRam00000000001b0f38._4_1_ = '-';
    uRam00000000001b0f38._5_1_ = '-';
    uRam00000000001b0f38._6_1_ = '-';
    uRam00000000001b0f38._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001b0f28._0_1_ = '-';
    uRam00000000001b0f28._1_1_ = '-';
    uRam00000000001b0f28._2_1_ = '-';
    uRam00000000001b0f28._3_1_ = '-';
    uRam00000000001b0f28._4_1_ = '-';
    uRam00000000001b0f28._5_1_ = '-';
    uRam00000000001b0f28._6_1_ = '-';
    uRam00000000001b0f28._7_1_ = '-';
    DAT_001b0f6f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}